

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

Result __thiscall tonk::gateway::ParsedURL::Parse(ParsedURL *this,string *url)

{
  undefined2 uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong in_RDX;
  long lVar5;
  Result *success;
  ParsedURL *pPVar6;
  string ip;
  string path;
  error_code ec;
  undefined1 local_a8 [16];
  undefined4 auStack_98 [3];
  undefined4 uStack_8c;
  ParsedURL *local_88;
  char *local_80 [2];
  char local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  error_code local_40;
  
  local_88 = this;
  std::__cxx11::string::_M_assign((string *)url);
  lVar3 = std::__cxx11::string::find((char)in_RDX,0x3a);
  lVar5 = -1;
  if (lVar3 + 1 != 0) {
    lVar5 = lVar3 + 1;
  }
  local_60 = local_50;
  local_58 = 0;
  local_50[0] = 0;
  lVar3 = std::__cxx11::string::find((char)in_RDX,0x2f);
  if (lVar3 == -1) {
    local_58 = 0;
    *local_60 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
  }
  if (lVar5 == -1) {
    iVar2 = 0x50;
LAB_00138374:
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    std::__cxx11::string::_M_assign((string *)(url + 2));
    uVar1 = 0x50;
    if (iVar2 != 0x1bb) {
      uVar1 = (undefined2)iVar2;
    }
    *(undefined2 *)&url[3]._M_dataplus._M_p = uVar1;
    std::__cxx11::string::_M_assign((string *)(url + 1));
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
    asio::ip::make_address((address *)local_a8,local_80[0],&local_40);
    url[3]._M_string_length = local_a8._0_8_;
    url[3].field_2._M_allocated_capacity = CONCAT44(local_a8._12_4_,local_a8._8_4_);
    *(ulong *)((long)&url[3].field_2 + 8) = CONCAT44(auStack_98[1],auStack_98[0]);
    url[4]._M_dataplus._M_p = (pointer)CONCAT44(uStack_8c,auStack_98[2]);
    if (local_40._M_value == 0) {
      asio::ip::detail::endpoint::endpoint
                ((endpoint *)local_a8,(address *)&url[3]._M_string_length,
                 *(unsigned_short *)&url[3]._M_dataplus._M_p);
      *(ulong *)((long)&url[4].field_2 + 4) = CONCAT44(auStack_98[0],local_a8._12_4_);
      *(ulong *)((long)&url[4].field_2 + 0xc) = CONCAT44(auStack_98[2],auStack_98[1]);
      url[4]._M_string_length = local_a8._0_8_;
      url[4].field_2._M_allocated_capacity = CONCAT44(local_a8._12_4_,local_a8._8_4_);
      (local_88->FullURL)._M_dataplus._M_p = (char *)0x0;
      pPVar6 = local_88;
      goto LAB_0013852e;
    }
    (**(code **)(*(long *)local_40._M_cat + 0x20))(local_a8);
    lVar5 = (long)local_40._M_value;
    pcVar4 = (char *)operator_new(0x38);
    *(char **)pcVar4 = "retrieveDescription: Invalid IP string";
    *(char **)(pcVar4 + 8) = pcVar4 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar4 + 8),local_a8._0_8_,
               CONCAT44(local_a8._12_4_,local_a8._8_4_) + local_a8._0_8_);
    pcVar4[0x28] = '\x02';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    *(long *)(pcVar4 + 0x30) = lVar5;
    (local_88->FullURL)._M_dataplus._M_p = pcVar4;
    pPVar6 = local_88;
    if ((undefined4 *)local_a8._0_8_ == auStack_98) goto LAB_0013852e;
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,in_RDX);
    pcVar4 = local_80[0];
    iVar2 = atoi(local_80[0]);
    if (0 < iVar2) {
      if (pcVar4 != local_70) {
        operator_delete(pcVar4);
      }
      goto LAB_00138374;
    }
    local_a8._0_8_ = auStack_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Port did not parse","");
    pcVar4 = (char *)operator_new(0x38);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    *(char **)(pcVar4 + 8) = pcVar4 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar4 + 8),local_a8._0_8_,
               CONCAT44(local_a8._12_4_,local_a8._8_4_) + local_a8._0_8_);
    pcVar4[0x28] = '\0';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    pcVar4[0x30] = '\x02';
    pcVar4[0x31] = '\0';
    pcVar4[0x32] = '\0';
    pcVar4[0x33] = '\0';
    pcVar4[0x34] = '\0';
    pcVar4[0x35] = '\0';
    pcVar4[0x36] = '\0';
    pcVar4[0x37] = '\0';
    (local_88->FullURL)._M_dataplus._M_p = pcVar4;
    pPVar6 = local_88;
    if ((undefined4 *)local_a8._0_8_ == auStack_98) goto LAB_0013852e;
  }
  pPVar6 = local_88;
  operator_delete((void *)local_a8._0_8_);
LAB_0013852e:
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return (Result)(ErrorResult *)pPVar6;
}

Assistant:

Result ParsedURL::Parse(const std::string& url)
{
    FullURL = url;

    size_t ipEnd, slash;

    // Find port offset
    size_t portStart = url.find(':');
    if (portStart == std::string::npos) {
        ipEnd = url.length();
        slash = std::string::npos;
    }
    else {
        ipEnd = portStart;
        ++portStart;
        slash = portStart;
    }

    size_t portEnd;
    std::string path;
    int port;

    // Find path offset relative to port
    slash = url.find('/', slash);
    if (slash == std::string::npos) {
        portEnd = url.length();
        path.clear();
    }
    else {
        portEnd = slash;
        if (ipEnd > slash) {
            ipEnd = slash;
        }
        path = url.substr(slash + 1);
    }

    // Parse out port field
    if (portStart == std::string::npos) {
        port = 80; // Default HTTP port
    }
    else {
        const std::string portStr = url.substr(portStart, portEnd - portStart);
        port = atoi(portStr.c_str());
        if (port <= 0) {
            return Result("Port did not parse");
        }
    }

    // Note that regardless of protocol we always connect on port 80 with
    // HTTP (no SSL encryption) unless a port is specified in the URL
    if (port == 443) {
        // Force port 80 instead of HTTPS since we do not support encryption
        port = 80;
    }

    // Parse out IP field
    std::string ip = url.substr(0, ipEnd);

    // Fill info
    IP = ip;
    Port = (uint16_t)port;
    XMLPath = path;

    asio::error_code ec;

    // Convert IP string to IP address
    IPAddr = asio::ip::make_address(ip, ec);

    if (ec) {
        return Result("retrieveDescription: Invalid IP string", ec.message(), ErrorType::Asio, ec.value());
    }

    TCPEndpoint = asio::ip::tcp::endpoint(IPAddr, Port);

    return Result::Success();
}